

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O3

DdNode * ComputeVarSetAndCountMinterms(DdManager *dd,DdNode *bVars,DdNode *bVarTop,uint *Cost)

{
  uint uVar1;
  DdNode *n;
  
  n = Cudd_bddAnd(dd,bVars,bVarTop);
  Cudd_Ref(n);
  s_Signature = s_Signature + 1;
  uVar1 = Extra_CountCofactorMinterms(dd,s_Encoded,n,s_VarAll);
  *Cost = uVar1;
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * ComputeVarSetAndCountMinterms( DdManager * dd, DdNode * bVars, DdNode * bVarTop, unsigned * Cost )
// takes bVars - the variables cofactored so far (some of them may be in negative polarity)
// bVarTop - the topmost variable w.r.t. which to cofactor (may be in negative polarity)
// returns the cost and the new set of variables (bVars & bVarTop)
{
    DdNode * bVarsRes;

    // get the resulting set of variables
    bVarsRes = Cudd_bddAnd( dd, bVars, bVarTop );  Cudd_Ref( bVarsRes );

    // increment signature before calling Cudd_CountCofactorMinterms()
    s_Signature++;
    *Cost = Extra_CountCofactorMinterms( dd, s_Encoded, bVarsRes, s_VarAll );

    Cudd_Deref( bVarsRes );
//  s_CountCalls++;
    return bVarsRes;
}